

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O3

void __thiscall ezc3d::c3d::frame(c3d *this,Frame *f,size_t idx,bool skipInternalUpdates)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parameters *pPVar2;
  int iVar3;
  Group *pGVar4;
  Parameter *pPVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  Points *pPVar7;
  size_t sVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer pbVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  Analogs *pAVar11;
  SubFrame *this_00;
  size_t sVar12;
  runtime_error *prVar13;
  undefined7 in_register_00000009;
  pointer pbVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string local_98;
  string local_78;
  double local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  DataNS::Data::frame((this->_data).
                      super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,f,
                      idx);
  if ((int)CONCAT71(in_register_00000009,skipInternalUpdates) == 0) {
    pPVar2 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"POINT","");
    pGVar4 = ParametersNS::Parameters::group(pPVar2,&local_98);
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"USED","");
    pPVar5 = ParametersNS::GroupNS::Group::parameter(pGVar4,&local_78);
    pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar5);
    iVar3 = *(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 != 0) {
      pPVar7 = DataNS::Frame::points(f);
      sVar8 = DataNS::Points3dNS::Points::nbPoints(pPVar7);
      if (sVar8 != (long)iVar3) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,
                   "Number of points in POINT:USED parameter must equal to the number of points sent in the frame"
                  );
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pPVar2 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"POINT","");
    pGVar4 = ParametersNS::Parameters::group(pPVar2,&local_98);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"LABELS","");
    pPVar5 = ParametersNS::GroupNS::Group::parameter(pGVar4,&local_78);
    __x = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pointNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_98,this);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar17 = 0;
      pbVar9 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p) {
          lVar15 = 0;
          uVar16 = 0;
          do {
            iVar3 = std::__cxx11::string::compare((string *)(local_98._M_dataplus._M_p + lVar15));
            pbVar9 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar14 = local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3 == 0) break;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 0x20;
          } while (uVar16 < (ulong)((long)(local_98._M_string_length -
                                          (long)local_98._M_dataplus._M_p) >> 5));
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)pbVar14 - (long)pbVar9 >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    pPVar7 = DataNS::Frame::points(f);
    sVar8 = DataNS::Points3dNS::Points::nbPoints(pPVar7);
    if (sVar8 != 0) {
      pPVar2 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"POINT","");
      pGVar4 = ParametersNS::Parameters::group(pPVar2,&local_98);
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RATE","");
      pPVar5 = ParametersNS::GroupNS::Group::parameter(pGVar4,&local_78);
      pvVar10 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar5);
      local_50 = *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((local_50 == 0.0) && (!NAN(local_50))) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,"Point frame rate must be specified if you add some");
        goto LAB_00123b94;
      }
    }
    pAVar11 = DataNS::Frame::analogs(f);
    sVar8 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar11);
    if (sVar8 != 0) {
      pPVar2 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ANALOG","");
      pGVar4 = ParametersNS::Parameters::group(pPVar2,&local_98);
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"RATE","");
      pPVar5 = ParametersNS::GroupNS::Group::parameter(pGVar4,&local_78);
      pvVar10 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar5);
      local_50 = *(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((local_50 == 0.0) && (!NAN(local_50))) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,"Analog frame rate must be specified if you add some");
LAB_00123b94:
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pPVar2 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ANALOG","");
    pGVar4 = ParametersNS::Parameters::group(pPVar2,&local_98);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"USED","");
    pPVar5 = ParametersNS::GroupNS::Group::parameter(pGVar4,&local_78);
    pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar5);
    iVar3 = *(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pAVar11 = DataNS::Frame::analogs(f);
    sVar8 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar11);
    if (sVar8 != 0) {
      pAVar11 = DataNS::Frame::analogs(f);
      this_00 = DataNS::AnalogsNS::Analogs::subframe(pAVar11,0);
      sVar8 = DataNS::AnalogsNS::SubFrame::nbChannels(this_00);
      sVar12 = Header::nbAnalogByFrame
                         ((this->_header).
                          super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((sVar8 != (long)iVar3) && (iVar3 != 0 || sVar12 != 0)) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar13,
                   "Number of analogs in ANALOG:USED parameter must equal the number of analogs sent in the frame"
                  );
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_78.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    updateParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_98,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return;
}

Assistant:

void ezc3d::c3d::frame(const ezc3d::DataNS::Frame &f, size_t idx,
                       bool skipInternalUpdates) {

  // Replace the jth frame
  _data->frame(f, idx);

  if (skipInternalUpdates)
    return;

  // Make sure f.points().points() is the same as data.f[ANY].points()
  size_t nPoints(static_cast<size_t>(
      parameters().group("POINT").parameter("USED").valuesAsInt()[0]));
  if (nPoints != 0 && f.points().nbPoints() != nPoints)
    throw std::runtime_error(
        "Number of points in POINT:USED parameter must equal to "
        "the number of points sent in the frame");

  std::vector<std::string> labels(
      parameters().group("POINT").parameter("LABELS").valuesAsString());

  try {
    // Check if all the labels are in the actual LABELSX parameter
    const std::vector<std::string> &namesParameter(pointNames());
    for (size_t i = 0; i < labels.size(); ++i) {
      for (size_t i = 0; i < namesParameter.size(); ++i) {
        if (!namesParameter[i].compare(labels[i])) {
          break;
        }
      }
    }
  } catch (const std::invalid_argument&) {
    throw std::invalid_argument("All the points in the frame must appear "
                                "in the POINT:LABELS parameter");
  }

  if (f.points().nbPoints() > 0 &&
      parameters().group("POINT").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Point frame rate must be specified if you add some");
  }
  if (f.analogs().nbSubframes() > 0 &&
      parameters().group("ANALOG").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Analog frame rate must be specified if you add some");
  }

  size_t nAnalogs(static_cast<size_t>(
      parameters().group("ANALOG").parameter("USED").valuesAsInt()[0]));
  size_t subSize(f.analogs().nbSubframes());
  if (subSize != 0) {
    size_t nChannel(f.analogs().subframe(0).nbChannels());
    size_t nAnalogByFrames(header().nbAnalogByFrame());
    if (!(nAnalogs == 0 && nAnalogByFrames == 0) && nChannel != nAnalogs)
      throw std::runtime_error(
          "Number of analogs in ANALOG:USED parameter must equal "
          "the number of analogs sent in the frame");
  }

  // Finalize the internal structure
  updateParameters();
}